

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O0

char * ODDLParser::OpenDDLParser::parseIntegerLiteral
                 (char *in,char *end,Value **integer,ValueType integerType)

{
  bool bVar1;
  char *__nptr;
  longlong value_00;
  ulonglong value_01;
  Value *pVVar2;
  uint64 uvalue;
  int64 value;
  char *start;
  ValueType integerType_local;
  Value **integer_local;
  char *end_local;
  char *in_local;
  
  *integer = (Value *)0x0;
  in_local = in;
  if (((in != (char *)0x0) && (in != end)) &&
     ((bVar1 = isIntegerType(integerType), bVar1 ||
      (bVar1 = isUnsignedIntegerType(integerType), bVar1)))) {
    __nptr = lookForNextToken<char>(in,end);
    for (end_local = __nptr; bVar1 = isSeparator<char>(*end_local), !bVar1 && end_local != end;
        end_local = end_local + 1) {
    }
    bVar1 = isNumeric<char>(*__nptr);
    if (bVar1) {
      value_00 = atoll(__nptr);
      value_01 = strtoull(__nptr,(char **)0x0,10);
      pVVar2 = ValueAllocator::allocPrimData(integerType,1);
      *integer = pVVar2;
      switch(integerType) {
      case ddl_int8:
        Value::setInt8(*integer,(int8)value_00);
        break;
      case ddl_int16:
        Value::setInt16(*integer,(int16)value_00);
        break;
      case ddl_int32:
        Value::setInt32(*integer,(int32)value_00);
        break;
      case ddl_int64:
        Value::setInt64(*integer,value_00);
        break;
      case ddl_unsigned_int8:
        Value::setUnsignedInt8(*integer,(uint8)value_01);
        break;
      case ddl_unsigned_int16:
        Value::setUnsignedInt16(*integer,(uint16)value_01);
        break;
      case ddl_unsigned_int32:
        Value::setUnsignedInt32(*integer,(uint32)value_01);
        break;
      case ddl_unsigned_int64:
        Value::setUnsignedInt64(*integer,value_01);
      }
    }
    in_local = end_local;
  }
  return in_local;
}

Assistant:

char *OpenDDLParser::parseIntegerLiteral( char *in, char *end, Value **integer, Value::ValueType integerType ) {
    *integer = ddl_nullptr;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    if( !(isIntegerType( integerType ) || isUnsignedIntegerType(integerType)) ) {
        return in;
    }

    in = lookForNextToken( in, end );
    char *start( in );
    while( !isSeparator( *in ) && in != end ) {
        ++in;
    }

    if( isNumeric( *start ) ) {
#ifdef OPENDDL_NO_USE_CPP11
        const int64 value( atol( start ) ); // maybe not really 64bit as atoll is but exists without c++11
        const uint64 uvalue( strtoul( start,ddl_nullptr,10 ) );
#else
        const int64 value( atoll( start ) );
        const uint64 uvalue( strtoull( start,ddl_nullptr,10 ) );
#endif
        *integer = ValueAllocator::allocPrimData( integerType );
        switch( integerType ) {
            case Value::ddl_int8:
                ( *integer )->setInt8( (int8) value );
                break;
            case Value::ddl_int16:
                ( *integer )->setInt16( ( int16 ) value );
                break;
            case Value::ddl_int32:
                ( *integer )->setInt32( ( int32 ) value );
                break;
            case Value::ddl_int64:
                ( *integer )->setInt64( ( int64 ) value );
                break;
            case Value::ddl_unsigned_int8:
                ( *integer )->setUnsignedInt8( (uint8) uvalue );
                break;
            case Value::ddl_unsigned_int16:
                ( *integer )->setUnsignedInt16( ( uint16 ) uvalue );
                break;
            case Value::ddl_unsigned_int32:
                ( *integer )->setUnsignedInt32( ( uint32 ) uvalue );
                break;
            case Value::ddl_unsigned_int64:
                ( *integer )->setUnsignedInt64( ( uint64 ) uvalue );
                break;
            default:
                break;
        }
    }

    return in;
}